

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTests.cpp
# Opt level: O2

void __thiscall
IsIterableNotContainingItemTests::IsIterableNotContainingItemTests
          (IsIterableNotContainingItemTests *this)

{
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__TestFixture_00280478;
  return;
}

Assistant:

virtual void Run()
	{
		Then("a vector containing the passed int is not true", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Item(5)(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::True);
		});

		Then("a vector not containing the passed int is not false", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Item(6)(std::vector<int>({1,2,3,4,5})), ut11::Is::Not::False);
		});

		Then("Is::Iterable::Containing::Item() is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Iterable::Not::Containing::Item(5)) >::value, ut11::Is::True);
		});

		Then("Is::Iterable::Containing::Item() has an error message", []() {
			AssertThat(ut11::Is::Iterable::Not::Containing::Item(5).GetErrorMessage(std::vector<int>()), ut11::Is::Not::EqualTo(""));
		});
	}